

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,char *val)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  reference pvVar7;
  reference pvVar8;
  invalid_argument *this;
  value_type *in_RDX;
  int in_ESI;
  double dVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  vector<double,_std::allocator<double>_> vec;
  long intVal;
  double value_1;
  NamedPoint npval;
  double dval;
  basic_string_view<char,_std::char_traits<char>_> value;
  defV val_dv;
  size_type in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  data_view *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe68;
  defV *in_stack_fffffffffffffe70;
  double local_180;
  string_view in_stack_fffffffffffffef0;
  complex<double> local_100;
  vector<double,_std::allocator<double>_> local_f0;
  __sv_type local_d0;
  defV *in_stack_ffffffffffffff40;
  DataType in_stack_ffffffffffffff4c;
  data_view *in_stack_ffffffffffffff50;
  double local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_t local_80;
  char *local_78;
  double local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68 [5];
  value_type *local_18;
  
  local_18 = in_RDX;
  if (in_ESI == 0) {
LAB_003a5d36:
    local_68[0] = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                            ((data_view *)in_stack_fffffffffffffe30);
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_68);
    if (sVar2 == 1) {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_68,0);
      *local_18 = *pvVar3;
    }
    else {
      local_80 = local_68[0]._M_len;
      local_78 = local_68[0]._M_str;
      local_70 = getDoubleFromString(in_stack_fffffffffffffef0);
      if ((local_70 != -1e+49) || (NAN(local_70))) {
        *local_18 = (value_type)(int)local_70;
      }
      else {
        pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](local_68,0);
        *local_18 = *pvVar3;
      }
    }
  }
  else {
    if (in_ESI == 1) {
      dVar9 = ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe30);
      *local_18 = (value_type)(int)dVar9;
      return;
    }
    if (in_ESI != 2) {
      if (in_ESI == 3) {
        ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe30);
        dVar9 = std::complex<double>::imag_abi_cxx11_(&local_100);
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          dVar9 = std::abs<double>((complex<double> *)in_stack_fffffffffffffe30);
        }
        else {
          dVar9 = std::complex<double>::real_abi_cxx11_(&local_100);
        }
        *local_18 = (value_type)(int)dVar9;
        return;
      }
      if (in_ESI == 4) {
        ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
                  (in_stack_fffffffffffffe48);
        sVar2 = CLI::std::vector<double,_std::allocator<double>_>::size(&local_f0);
        if (sVar2 == 1) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_f0,0);
          local_180 = *pvVar7;
        }
        else {
          local_180 = vectorNorm(in_stack_fffffffffffffe40);
        }
        *local_18 = (value_type)(int)local_180;
        CLI::std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40);
        return;
      }
      if (in_ESI == 5) {
        ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
        interpret(in_stack_fffffffffffffe48);
        sVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                          ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                           &stack0xfffffffffffffee8);
        if (sVar2 == 1) {
          pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                   operator[]((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&stack0xfffffffffffffee8,0);
          dVar9 = std::complex<double>::imag_abi_cxx11_(pvVar8);
          if ((dVar9 != 0.0) || (NAN(dVar9))) {
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       &stack0xfffffffffffffee8,0);
            pvVar10 = (vector<double,_std::allocator<double>_> *)
                      std::abs<double>((complex<double> *)in_stack_fffffffffffffe30);
          }
          else {
            pvVar8 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                     operator[]((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                 *)&stack0xfffffffffffffee8,0);
            pvVar10 = (vector<double,_std::allocator<double>_> *)
                      std::complex<double>::real_abi_cxx11_(pvVar8);
          }
        }
        else {
          in_stack_fffffffffffffe40 =
               (vector<double,_std::allocator<double>_> *)
               vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          in_stack_fffffffffffffe40);
          pvVar10 = in_stack_fffffffffffffe40;
        }
        *local_18 = (value_type)(int)(double)pvVar10;
        CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffe40);
        return;
      }
      if (in_ESI == 6) {
        ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe48);
        uVar1 = std::isnan(local_98);
        if ((uVar1 & 1) == 0) {
          *local_18 = (value_type)(int)local_98;
        }
        else {
          sVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xffffffffffffff48);
          if (sVar4 == 1) {
            pvVar5 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            *local_18 = *pvVar5;
          }
          else {
            local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 (in_stack_fffffffffffffe30);
            dVar9 = getDoubleFromString(in_stack_fffffffffffffef0);
            if ((dVar9 != -1e+49) || (NAN(dVar9))) {
              *local_18 = (value_type)(int)dVar9;
            }
            else {
              pvVar5 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              *local_18 = *pvVar5;
            }
          }
        }
        NamedPoint::~NamedPoint((NamedPoint *)0x3a5fce);
        return;
      }
      if (in_ESI == 7) {
        local_90 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                             ((data_view *)in_stack_fffffffffffffe30);
        pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_90,0)
        ;
        *local_18 = *pvVar3;
        return;
      }
      if (in_ESI != 8) {
        if (in_ESI != 9) {
          if (in_ESI == 0x19) {
LAB_003a62ee:
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"unrecognized helics type");
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (in_ESI == 0x1e) {
            readJsonValue_abi_cxx11_((data_view *)npval.name._M_string_length);
            valueExtract(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
            CLI::std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x3a62c9);
            return;
          }
          if (in_ESI == 0x21) goto LAB_003a62ee;
          if (in_ESI == 0x62ae) {
            CLI::std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x3a5cc7);
            valueExtract(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff40);
            valueExtract(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
            CLI::std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x3a5d09);
            return;
          }
        }
        goto LAB_003a5d36;
      }
    }
    lVar6 = ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe30);
    *local_18 = (value_type)lVar6;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, char& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            auto value = ValueConverter<std::string_view>::interpret(data);
            if (value.size() == 1) {
                val = value[0];
            } else {
                const double dval = getDoubleFromString(value);
                if (dval != invalidDouble) {
                    val = static_cast<char>(dval);
                } else {
                    val = value[0];
                }
            }
        }

        break;
        case DataType::HELICS_BOOL:
            val = ValueConverter<std::string_view>::interpret(data)[0];
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                if (npval.name.size() == 1) {
                    val = npval.name[0];
                } else {
                    const double value = getDoubleFromString(npval.name);
                    if (value != invalidDouble) {
                        val = static_cast<char>(value);
                    } else {
                        val = npval.name[0];
                    }
                }
            } else {
                val = static_cast<char>(npval.value);
            }
            break;
        }
        case DataType::HELICS_DOUBLE: {
            val = static_cast<char>(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto intVal = ValueConverter<int64_t>::interpret(data);
            val = static_cast<char>(intVal);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = static_cast<char>((vec.size() == 1) ? vec[0] : vectorNorm(vec));
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = static_cast<char>((cval.imag() == 0.0) ? cval.real() : std::abs(cval));
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = static_cast<char>(
                (cvec.size() == 1) ?
                    ((cvec[0].imag() == 0.0) ? cvec[0].real() : std::abs(cvec[0])) :
                    vectorNorm(cvec));
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}